

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O1

void ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  uchar value;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint count;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar6 = std::istream::get();
  uVar10 = (ulong)uVar6;
  iVar9 = 8;
  do {
    while( true ) {
      if (iVar9 == 0) {
        uVar6 = std::istream::get();
        uVar10 = (ulong)uVar6;
        iVar9 = 8;
      }
      cVar2 = (char)uVar10;
      uVar10 = uVar10 * 2;
      iVar9 = iVar9 + -1;
      if (-1 < cVar2) break;
      value = std::istream::get();
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::
      WriteImplementation(output,value);
    }
    uVar8 = uVar10;
    if (iVar9 == 0) {
      uVar6 = std::istream::get();
      uVar8 = (ulong)uVar6;
      iVar9 = 8;
    }
    uVar10 = uVar8 * 2;
    iVar9 = iVar9 + -1;
    uVar6 = std::istream::get();
    if ((char)uVar8 < '\0') {
      uVar7 = std::istream::get();
      if ((uVar6 & 7) == 0) {
        bVar5 = std::istream::get();
        if (bVar5 != 0) {
          count = bVar5 + 9;
          goto LAB_00109b2e;
        }
        bVar4 = true;
        count = 9;
        bVar3 = false;
      }
      else {
        count = 10 - (uVar6 & 7);
LAB_00109b2e:
        bVar4 = false;
        bVar3 = true;
      }
      if (bVar3) {
        uVar6 = 0x2000 - ((uVar6 & 0xf8) << 5 | uVar7 & 0xff);
        goto LAB_00109b4a;
      }
    }
    else {
      if (iVar9 == 0) {
        uVar7 = std::istream::get();
        uVar10 = (ulong)uVar7;
        iVar9 = 8;
      }
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) {
        uVar7 = std::istream::get();
        uVar8 = (ulong)uVar7;
        iVar9 = 8;
      }
      else {
        uVar8 = uVar10 * 2;
      }
      uVar6 = 0x100 - (uVar6 & 0xff);
      uVar1 = uVar10 >> 7;
      uVar10 = uVar8 * 2;
      iVar9 = iVar9 + -1;
      count = (uint)(uVar8 >> 7) & 1 | ((uint)uVar1 & 1) * 2 + 2;
LAB_00109b4a:
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,_-1>::
      Copy(output,uVar6,count);
      bVar4 = false;
    }
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				BitField<decltype(input)> descriptor_bits(input);

				for (;;)
				{
					if (descriptor_bits.Pop())
					{
						output.Write(input.Read());
					}
					else
					{
						unsigned int offset;
						unsigned int count;

						if (descriptor_bits.Pop())
						{
							const unsigned int high_byte = input.Read();
							const unsigned int low_byte = input.Read();

							offset = ((high_byte & 0xF8) << 5) | low_byte;
							offset = 0x2000 - offset;
							count = high_byte & 7;

							if (count != 0)
							{
								count = 10 - count;
							}
							else
							{
								count = input.Read() + 9;

								if (count == 9)
									break;
							}
						}
						else
						{
							offset = 0x100 - input.Read();

							count = 2;

							if (descriptor_bits.Pop())
								count += 2;
							if (descriptor_bits.Pop())
								count += 1;
						}

						output.Copy(offset, count);
					}
				}
			}